

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

result_type time_plain<trng::lcg64>(lcg64 *r)

{
  long lVar1;
  result_type rVar2;
  result_type rVar3;
  long lVar4;
  string res;
  string local_40;
  double local_20;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  rVar2 = (r->S).r;
  lVar4 = 0x1000000;
  rVar3 = 0;
  do {
    rVar2 = rVar2 * (r->P).a + (r->P).b;
    rVar3 = rVar3 + rVar2;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  (r->S).r = rVar2;
  lVar4 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar4 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return rVar3;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}